

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

Array2D<float> * __thiscall
pbrt::Array2D<float>::operator=(Array2D<float> *this,Array2D<float> *other)

{
  int iVar1;
  memory_resource *pmVar2;
  float *pfVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  int iVar7;
  undefined4 extraout_var;
  uint uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Bounds2<int> tmp;
  float *pfVar8;
  
  pmVar2 = (this->allocator).memoryResource;
  if (pmVar2 == (other->allocator).memoryResource) {
    TVar4 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    TVar5 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    TVar6 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
         (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar6;
    (other->extent).pMin.super_Tuple2<pbrt::Point2,_int> = TVar4;
    (other->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar5;
    pfVar8 = this->values;
    this->values = other->values;
    other->values = pfVar8;
  }
  else {
    iVar7 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar1 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    if ((((other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x == iVar7) &&
        ((other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y == iVar1)) &&
       (auVar11._8_8_ = 0, auVar11._0_8_ = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>,
       auVar13._8_8_ = 0, auVar13._0_8_ = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>,
       uVar10 = vpcmpd_avx512vl(auVar11,auVar13,4), (uVar10 & 3) == 0)) {
      uVar9 = ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar1) *
              ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar7);
      if (0 < (int)uVar9) {
        pfVar8 = this->values;
        pfVar3 = other->values;
        uVar10 = 0;
        do {
          pfVar8[uVar10] = pfVar3[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      TVar4 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
      (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
           (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
      (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar4;
    }
    else {
      if (this->values != (float *)0x0) {
        (*pmVar2->_vptr_memory_resource[3])
                  (pmVar2,this->values,
                   (long)(((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar7) *
                         ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar1)) << 2,4);
      }
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
      auVar13 = vpsubd_avx(auVar12,auVar14);
      auVar11 = vpshufd_avx(auVar13,0x55);
      auVar11 = vpmulld_avx(auVar11,auVar13);
      uVar9 = auVar11._0_4_;
      if (uVar9 == 0) {
        pfVar8 = (float *)0x0;
      }
      else {
        pmVar2 = (this->allocator).memoryResource;
        iVar7 = (*pmVar2->_vptr_memory_resource[2])(pmVar2,(long)(int)uVar9 << 2,4);
        pfVar8 = (float *)CONCAT44(extraout_var,iVar7);
      }
      this->values = pfVar8;
      if (0 < (int)uVar9) {
        pfVar3 = other->values;
        uVar10 = 0;
        do {
          pfVar8[uVar10] = pfVar3[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
    }
  }
  return this;
}

Assistant:

Array2D &operator=(Array2D &&other) {
        if (allocator == other.allocator) {
            pstd::swap(extent, other.extent);
            pstd::swap(values, other.values);
        } else if (extent == other.extent) {
            int n = extent.Area();
            for (int i = 0; i < n; ++i) {
                allocator.destroy(values + i);
                allocator.construct(values + i, other.values[i]);
            }
            extent = other.extent;
        } else {
            int n = extent.Area();
            for (int i = 0; i < n; ++i)
                allocator.destroy(values + i);
            allocator.deallocate_object(values, n);

            int no = other.extent.Area();
            values = allocator.allocate_object<T>(no);
            for (int i = 0; i < no; ++i)
                allocator.construct(values + i, other.values[i]);
        }
        return *this;
    }